

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O1

void __thiscall TestSuite::reportTestResult(TestSuite *this,string *test_name,int result)

{
  bool *pbVar1;
  pointer pcVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  string res_msg;
  string time_str;
  char msg_buf [1024];
  undefined1 *local_468;
  long local_460;
  undefined1 local_458 [16];
  string local_448;
  char local_428 [1032];
  
  auVar8 = std::chrono::_V2::system_clock::now();
  dVar7 = ((double)(auVar8._0_8_ - (this->startTimeLocal).__d.__r) / 1000000000.0) * 1000000.0;
  uVar3 = (ulong)dVar7;
  usToString_abi_cxx11_
            (&local_448,
             (TestSuite *)((long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3),
             auVar8._8_8_);
  psVar4 = getResMsg_abi_cxx11_();
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_468 = local_458;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar2,pcVar2 + psVar4->_M_string_length);
  pcVar5 = ": ";
  if (local_460 == 0) {
    pcVar5 = "";
  }
  sprintf(local_428,"%s (\x1b[33m%s\x1b[0m)%s%s",(test_name->_M_dataplus)._M_p,
          local_448._M_dataplus._M_p,pcVar5,local_468);
  if (result < 0) {
    lVar6 = 0x10;
    pcVar5 = "[ \x1b[31mFAIL\x1b[0m ] %s\n";
  }
  else {
    if ((((this->options).printTestMessage == false) && (this->displayMsg != true)) ||
       (this->suppressMsg != false)) {
      printf("\x1b[1A");
      putchar(0xd);
    }
    else {
      printf("\x1b[1;30m   === TEST MESSAGE (END) ===\n\x1b[0m");
    }
    lVar6 = 8;
    pcVar5 = "[ \x1b[32mPASS\x1b[0m ] %s\n";
  }
  printf(pcVar5,local_428);
  pbVar1 = &(this->options).printTestMessage + lVar6;
  *(long *)pbVar1 = *(long *)pbVar1 + 1;
  if ((result != 0) &&
     (((this->options).abortOnFailure != false || (this->forceAbortOnFailure == true)))) {
    abort();
  }
  psVar4 = getTestName_abi_cxx11_();
  psVar4->_M_string_length = 0;
  *(psVar4->_M_dataplus)._M_p = '\0';
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  return;
}

Assistant:

void reportTestResult(const std::string& test_name,
                          int result)
    {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeLocal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        char msg_buf[1024];
        std::string res_msg = TestSuite::getResMsg();
        sprintf(msg_buf, "%s (" _CL_BROWN("%s") ")%s%s",
                test_name.c_str(),
                time_str.c_str(),
                (res_msg.empty() ? "" : ": "),
                res_msg.c_str() );

        if (result < 0) {
            printf("[ " _CL_RED("FAIL") " ] %s\n", msg_buf);
            cntFail++;
        } else {
            if ( (options.printTestMessage || displayMsg) &&
                 !suppressMsg ) {
                printf(_CL_D_GRAY("   === TEST MESSAGE (END) ===\n"));
            } else {
                // Move a line up.
                printf("\033[1A");
                // Clear current line.
                printf("\r");
                // And then overwrite.
            }
            printf("[ " _CL_GREEN("PASS") " ] %s\n", msg_buf);
            cntPass++;
        }

        if ( result != 0 &&
             (options.abortOnFailure || forceAbortOnFailure) ) {
            abort();
        }
        getTestName().clear();
    }